

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::GPUShaderFP64Test2::getRequiredComponentsNumber
          (GPUShaderFP64Test2 *this,uniformTypeDetails *uniform_type)

{
  GLuint local_2c;
  GLuint alignment;
  GLuint column_length;
  uniformTypeDetails *uniform_type_local;
  GPUShaderFP64Test2 *this_local;
  
  local_2c = uniform_type->m_n_rows;
  if (uniform_type->m_n_columns == 1) {
    this_local._4_4_ = local_2c << 1;
  }
  else {
    if (local_2c == 3) {
      local_2c = 4;
    }
    this_local._4_4_ = local_2c * 2 * uniform_type->m_n_columns;
  }
  return this_local._4_4_;
}

Assistant:

glw::GLuint GPUShaderFP64Test2::getRequiredComponentsNumber(const uniformTypeDetails& uniform_type) const
{
	static const glw::GLuint type_size	 = 2; /* double takes 2 N */
	const glw::GLuint		 column_length = uniform_type.m_n_rows;

	if (1 == uniform_type.m_n_columns)
	{
		return type_size * column_length;
	}
	else
	{
		const glw::GLuint alignment = type_size * ((3 == column_length) ? 4 : column_length);

		return alignment * uniform_type.m_n_columns;
	}
}